

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O3

float ** Llb_ManComputeQuant(Llb_Mtr_t *p)

{
  ulong uVar1;
  int iVar2;
  float **ppfVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  ppfVar3 = (float **)Extra_ArrayAlloc(p->nCols,p->nCols,4);
  iVar2 = p->nCols;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      ppfVar3[lVar4][lVar4] = 0.0;
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
    if (2 < iVar2) {
      uVar7 = (ulong)(iVar2 - 1);
      uVar5 = 2;
      uVar8 = 1;
      do {
        uVar1 = uVar8 + 1;
        uVar6 = uVar5;
        if (uVar1 < uVar7) {
          do {
            iVar2 = Llb_ManComputeCommonQuant(p,(int)uVar8,(int)uVar6);
            ppfVar3[uVar6][uVar8] = (float)iVar2;
            ppfVar3[uVar8][uVar6] = (float)iVar2;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
        uVar5 = uVar5 + 1;
        uVar8 = uVar1;
      } while (uVar1 != uVar7);
    }
  }
  return ppfVar3;
}

Assistant:

float ** Llb_ManComputeQuant( Llb_Mtr_t * p )
{
    float ** pCosts;
    int i, k;
    // alloc and clean
    pCosts = (float **)Extra_ArrayAlloc( p->nCols, p->nCols, sizeof(float) );
    for ( i = 0; i < p->nCols; i++ )
    for ( k = 0; k < p->nCols; k++ )
        pCosts[i][i] = 0.0;
    // fill up
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
        pCosts[i][k] = pCosts[k][i] = Llb_ManComputeCommonQuant( p, i, k );
    return pCosts;
}